

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier_it_test.cpp
# Opt level: O2

void __thiscall license::test::volid_lic_file::test_method(volid_lic_file *this)

{
  FUNCTION_RETURN FVar1;
  log_level lVar2;
  unit_test_log_t local_69;
  vector<DiskInfo,_std::allocator<DiskInfo>_> diskInfos;
  HwIdentifier identifier_out;
  undefined1 local_40 [16];
  undefined1 *local_30;
  char *local_28;
  begin local_20;
  
  hw_identifier::HwIdentifier::HwIdentifier(&identifier_out);
  diskInfos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  diskInfos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  diskInfos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  FVar1 = getDiskInfos(&diskInfos);
  if (((FVar1 == FUNC_RET_BUFFER_TOO_SMALL) || (FVar1 == FUNC_RET_OK)) &&
     (diskInfos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      diskInfos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    std::__cxx11::string::string((string *)local_40,"volid_lic_file",(allocator *)&local_20);
    generate_and_verify_license(STRATEGY_DISK,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    local_20.m_file_name.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/hw_identifier_it_test.cpp"
    ;
    local_20.m_file_name.m_end = "";
    local_20.m_line_num = 0x39;
    lVar2 = boost::unit_test::unit_test_log_t::operator<<
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_20);
    boost::unit_test::unit_test_log_t::operator()(&local_69,lVar2);
    local_40[8] = false;
    local_40._0_8_ = &PTR__lazy_ostream_0056b6b0;
    local_30 = boost::unit_test::lazy_ostream::inst;
    local_28 = "No disk found skipping testing disk hardware identifier";
    boost::unit_test::ut_detail::entry_value_collector::operator<<
              ((entry_value_collector *)&local_69,(lazy_ostream *)local_40);
    boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
              ((entry_value_collector *)&local_69);
  }
  std::_Vector_base<DiskInfo,_std::allocator<DiskInfo>_>::~_Vector_base
            (&diskInfos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>);
  hw_identifier::HwIdentifier::~HwIdentifier(&identifier_out);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(volid_lic_file) {
	HwIdentifier identifier_out;
	vector<DiskInfo> diskInfos;
	FUNCTION_RETURN result_diskinfos = getDiskInfos(diskInfos);
	if ((result_diskinfos == FUNC_RET_BUFFER_TOO_SMALL || result_diskinfos == FUNC_RET_OK) && diskInfos.size() > 0) {
		generate_and_verify_license(LCC_API_HW_IDENTIFICATION_STRATEGY::STRATEGY_DISK, "volid_lic_file");
	} else {
		BOOST_TEST_MESSAGE("No disk found skipping testing disk hardware identifier");
	}
}